

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O2

int TransferToublox(UBLOX *publox,uchar *buf,int buflen)

{
  int iVar1;
  
  iVar1 = WriteAllRS232Port(&publox->RS232Port,buf,buflen);
  if (iVar1 == 0) {
    iVar1 = 0;
    if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
      fwrite(buf,(long)buflen,1,(FILE *)publox->pfSaveFile);
      fflush((FILE *)publox->pfSaveFile);
    }
  }
  else {
    puts("Error writing data to a ublox. ");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int TransferToublox(UBLOX* publox, unsigned char* buf, int buflen)
{
	if (WriteAllRS232Port(&publox->RS232Port, buf, buflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(buf, buflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	return EXIT_SUCCESS;
}